

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

bool __thiscall sf::Font::loadFromStream(Font *this,InputStream *stream)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  undefined8 uVar5;
  EVP_PKEY_CTX *in_RSI;
  Font *in_RDI;
  FT_Stroker stroker;
  FT_Face_conflict face;
  FT_Open_Args args;
  FT_StreamRec *rec;
  FT_Library library;
  bool local_9a;
  allocator local_99;
  string local_98 [32];
  void *local_78;
  void *local_70;
  undefined4 local_68 [8];
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 *local_28;
  void *local_20;
  EVP_PKEY_CTX *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  cleanup(in_RDI,in_RSI);
  piVar3 = (int *)operator_new(4);
  *piVar3 = 1;
  in_RDI->m_refCount = piVar3;
  iVar2 = FT_Init_FreeType(&local_20);
  if (iVar2 == 0) {
    in_RDI->m_library = local_20;
    (**(code **)(*(long *)local_18 + 0x18))();
    local_28 = (undefined8 *)operator_new(0x50);
    memset(local_28,0,0x50);
    *local_28 = 0;
    uVar5 = (**(code **)(*(long *)local_18 + 0x28))();
    local_28[1] = uVar5;
    local_28[2] = 0;
    local_28[3] = local_18;
    local_28[5] = anon_unknown.dwarf_dec4c::read;
    local_28[6] = anon_unknown.dwarf_dec4c::close;
    local_68[0] = 2;
    local_48 = local_28;
    local_40 = 0;
    iVar2 = FT_Open_Face(in_RDI->m_library,local_68,0,&local_70);
    if (iVar2 == 0) {
      iVar2 = FT_Stroker_New(in_RDI->m_library,&local_78);
      if (iVar2 == 0) {
        iVar2 = FT_Select_Charmap(local_70,0x756e6963);
        if (iVar2 == 0) {
          in_RDI->m_stroker = local_78;
          in_RDI->m_face = local_70;
          in_RDI->m_streamRec = local_28;
          local_9a = *(long *)((long)local_70 + 0x28) == 0;
          if (local_9a) {
            std::__cxx11::string::string(local_98);
          }
          else {
            pcVar1 = *(char **)((long)local_70 + 0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_98,pcVar1,&local_99);
          }
          local_9a = !local_9a;
          std::__cxx11::string::operator=((string *)&in_RDI->m_info,local_98);
          std::__cxx11::string::~string(local_98);
          if (local_9a) {
            std::allocator<char>::~allocator((allocator<char> *)&local_99);
          }
          local_1 = true;
        }
        else {
          poVar4 = err();
          poVar4 = std::operator<<(poVar4,
                                   "Failed to load font from stream (failed to set the Unicode character set)"
                                  );
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          FT_Done_Face(local_70);
          FT_Stroker_Done(local_78);
          if (local_28 != (undefined8 *)0x0) {
            operator_delete(local_28);
          }
          local_1 = false;
        }
      }
      else {
        poVar4 = err();
        poVar4 = std::operator<<(poVar4,
                                 "Failed to load font from stream (failed to create the stroker)");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        FT_Done_Face(local_70);
        if (local_28 != (undefined8 *)0x0) {
          operator_delete(local_28);
        }
        local_1 = false;
      }
    }
    else {
      poVar4 = err();
      poVar4 = std::operator<<(poVar4,
                               "Failed to load font from stream (failed to create the font face)");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      if (local_28 != (undefined8 *)0x0) {
        operator_delete(local_28);
      }
      local_1 = false;
    }
  }
  else {
    poVar4 = err();
    poVar4 = std::operator<<(poVar4,
                             "Failed to load font from stream (failed to initialize FreeType)");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Font::loadFromStream(InputStream& stream)
{
    // Cleanup the previous resources
    cleanup();
    m_refCount = new int(1);

    // Initialize FreeType
    // Note: we initialize FreeType for every font instance in order to avoid having a single
    // global manager that would create a lot of issues regarding creation and destruction order.
    FT_Library library;
    if (FT_Init_FreeType(&library) != 0)
    {
        err() << "Failed to load font from stream (failed to initialize FreeType)" << std::endl;
        return false;
    }
    m_library = library;

    // Make sure that the stream's reading position is at the beginning
    stream.seek(0);

    // Prepare a wrapper for our stream, that we'll pass to FreeType callbacks
    FT_StreamRec* rec = new FT_StreamRec;
    std::memset(rec, 0, sizeof(*rec));
    rec->base               = NULL;
    rec->size               = static_cast<unsigned long>(stream.getSize());
    rec->pos                = 0;
    rec->descriptor.pointer = &stream;
    rec->read               = &read;
    rec->close              = &close;

    // Setup the FreeType callbacks that will read our stream
    FT_Open_Args args;
    args.flags  = FT_OPEN_STREAM;
    args.stream = rec;
    args.driver = 0;

    // Load the new font face from the specified stream
    FT_Face face;
    if (FT_Open_Face(static_cast<FT_Library>(m_library), &args, 0, &face) != 0)
    {
        err() << "Failed to load font from stream (failed to create the font face)" << std::endl;
        delete rec;
        return false;
    }

    // Load the stroker that will be used to outline the font
    FT_Stroker stroker;
    if (FT_Stroker_New(static_cast<FT_Library>(m_library), &stroker) != 0)
    {
        err() << "Failed to load font from stream (failed to create the stroker)" << std::endl;
        FT_Done_Face(face);
        delete rec;
        return false;
    }

    // Select the Unicode character map
    if (FT_Select_Charmap(face, FT_ENCODING_UNICODE) != 0)
    {
        err() << "Failed to load font from stream (failed to set the Unicode character set)" << std::endl;
        FT_Done_Face(face);
        FT_Stroker_Done(stroker);
        delete rec;
        return false;
    }

    // Store the loaded font in our ugly void* :)
    m_stroker = stroker;
    m_face = face;
    m_streamRec = rec;

    // Store the font information
    m_info.family = face->family_name ? face->family_name : std::string();

    return true;
}